

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveTopologyTest::createBufferData
          (PrimitiveTopologyTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000014;
  int vertexNdx_3;
  int iVar4;
  int vertexNdx_1;
  int vertexNdx;
  float fVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Vertex4RGBA vertex;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  Vertex4RGBA defaultVertex;
  float local_d4;
  float local_d0;
  float local_cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  ulong local_a8;
  float local_a0;
  value_type local_9c;
  float local_7c;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *local_58;
  value_type local_50;
  
  local_a8 = CONCAT44(in_register_00000014,primitiveCount);
  local_50.position.m_data[0] = -1.0;
  local_50.position.m_data[1] = -1.0;
  local_50.position.m_data[2] = 0.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = 0.0;
  local_50.color.m_data[1] = 1.0;
  local_50.color.m_data[2] = 0.0;
  local_50.color.m_data[3] = 1.0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    iVar3 = ~((int)(((uint)(local_a8 >> 0x1f) & 1) + primitiveCount) >> 1) + primitiveCount;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    iVar3 = primitiveCount + -1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    iVar3 = (int)(((uint)(local_a8 >> 0x1f) & 1) + primitiveCount) >> 1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    uVar2 = ((uint)(local_a8 >> 0x1f) & 1) + primitiveCount;
    iVar3 = ((((int)uVar2 >> 1) + primitiveCount * 2) - (uVar2 & 0xfffffffe)) + -1;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    iVar3 = primitiveCount - ((int)(((uint)(local_a8 >> 0x1f) & 1) + primitiveCount) >> 1);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    local_cc = 0.8;
    local_d0 = 0.8;
    goto LAB_004febb7;
  default:
    local_d0 = 1.6;
    local_cc = 0.0;
    goto LAB_004febb7;
  }
  local_d0 = 1.6;
  local_cc = 1.6 / (float)iVar3;
LAB_004febb7:
  local_60 = indexData;
  local_58 = vertexData;
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    if (0 < primitiveCount) {
      fVar5 = 0.0;
      do {
        local_9c.position.m_data[0] = (float)((uint)fVar5 >> 1) * local_cc + -0.8;
        local_9c.position.m_data[1] = (float)((uint)fVar5 & 1) * local_d0 + -0.8;
        local_9c.position.m_data[2] = 0.0;
        local_9c.position.m_data[3] = 1.0;
        local_9c.color.m_data[0] = 1.0;
        local_9c.color.m_data[1] = 0.0;
        local_9c.color.m_data[2] = 0.0;
        local_9c.color.m_data[3] = 1.0;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back(&local_78,&local_9c);
        local_d4 = fVar5;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
        }
        else {
          *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)fVar5;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        fVar5 = (float)((int)fVar5 + 1);
      } while ((float)local_a8 != fVar5);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
    if (0 < primitiveCount) {
      iVar3 = 0;
      fVar5 = 0.0;
      do {
        iVar7 = 0;
        local_a0 = fVar5;
        do {
          fVar5 = (float)(iVar3 + iVar7);
          local_9c.position.m_data[0] = (float)((int)fVar5 / 2) * local_cc + -0.8;
          local_9c.position.m_data[1] = (float)iVar7 * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = fVar5;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar5;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 == 1);
        fVar5 = (float)((int)local_a0 + 1);
        iVar3 = iVar3 + 2;
      } while (fVar5 != (float)local_a8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    if (0 < primitiveCount) {
      local_a0 = local_d0 + -0.8;
      local_a8 = (ulong)(uint)-primitiveCount;
      fVar5 = 1.4013e-45;
      do {
        if (fVar5 == 1.4013e-45) {
          local_9c.position.m_data[0] = -0.8;
          local_9c.position.m_data[1] = -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 0.0;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_9c.position.m_data[0] = -0.8;
          local_9c.position.m_data[1] = local_a0;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 1.4013e-45;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 1;
LAB_004ff168:
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_9c.position.m_data[0] = (float)((uint)fVar5 >> 1) * local_cc + -0.8;
          local_9c.position.m_data[1] = (float)((uint)fVar5 & 1) * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = fVar5;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar5;
            goto LAB_004ff168;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
        }
        iVar3 = (int)local_a8 + (int)fVar5;
        fVar5 = (float)((int)fVar5 + 1);
      } while (iVar3 != 0);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    if (0 < primitiveCount) {
      iVar3 = 0;
      fVar5 = 0.0;
      do {
        iVar7 = 0;
        local_a0 = fVar5;
        do {
          fVar5 = (float)(iVar3 + iVar7);
          local_9c.position.m_data[0] = (float)((int)fVar5 / 2) * local_cc + -0.8;
          local_9c.position.m_data[1] = (float)((int)fVar5 % 2) * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = fVar5;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar5;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != 3);
        fVar5 = (float)((int)local_a0 + 1);
        iVar3 = iVar3 + 3;
      } while (fVar5 != (float)local_a8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    if (0 < primitiveCount) {
      iVar3 = 0;
      do {
        if (iVar3 == 0) {
          uVar6 = 0;
          do {
            fVar5 = (float)uVar6;
            local_9c.position.m_data[0] = (float)(int)(uVar6 >> 1) * local_cc + -0.8;
            local_9c.position.m_data[1] = (float)((uint)fVar5 & 1) * local_d0 + -0.8;
            local_9c.position.m_data[2] = 0.0;
            local_9c.position.m_data[3] = 1.0;
            local_9c.color.m_data[0] = 1.0;
            local_9c.color.m_data[1] = 0.0;
            local_9c.color.m_data[2] = 0.0;
            local_9c.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_78,&local_9c);
            local_d4 = fVar5;
            if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
            }
            else {
              *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)fVar5;
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar6 = (ulong)((int)fVar5 + 1U);
          } while ((int)fVar5 + 1U != 3);
        }
        else {
          fVar5 = (float)(iVar3 + 2);
          uVar2 = (iVar3 - ((int)fVar5 >> 0x1f)) + 2;
          local_9c.position.m_data[0] = (float)((int)uVar2 >> 1) * local_cc + -0.8;
          local_9c.position.m_data[1] =
               (float)(int)((int)fVar5 - (uVar2 & 0xfffffffe)) * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = fVar5;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar5;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        iVar3 = iVar3 + 1;
      } while ((float)iVar3 != (float)local_a8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    if (0 < primitiveCount) {
      local_a0 = 1.5707964;
      if (6.2831855 / (float)primitiveCount <= 1.5707964) {
        local_a0 = 6.2831855 / (float)primitiveCount;
      }
      iVar3 = 1;
      do {
        if (iVar3 == 1) {
          local_9c.position.m_data[0] = 0.0;
          local_9c.position.m_data[1] = 0.0;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 0.0;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_9c.position.m_data[0] = local_cc;
          local_9c.position.m_data[1] = 0.0;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 1.4013e-45;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 1;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          fVar5 = cosf(local_a0);
          local_a8 = CONCAT44(local_a8._4_4_,fVar5);
          local_9c.position.m_data[1] = sinf(local_a0);
          local_9c.position.m_data[0] = (float)local_a8 * local_cc;
          local_9c.position.m_data[1] = local_9c.position.m_data[1] * local_d0;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 2.8026e-45;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 2;
LAB_004ff5b6:
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_7c = (float)iVar3 * local_a0;
          fVar5 = cosf(local_7c);
          local_a8 = CONCAT44(local_a8._4_4_,fVar5);
          local_9c.position.m_data[1] = sinf(local_7c);
          local_9c.position.m_data[0] = (float)local_a8 * local_cc;
          local_9c.position.m_data[1] = local_9c.position.m_data[1] * local_d0;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = (float)(iVar3 + 1);
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_d4;
            goto LAB_004ff5b6;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
        }
        bVar8 = iVar3 != primitiveCount;
        iVar3 = iVar3 + 1;
      } while (bVar8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_78,&local_50);
    if (0 < (int)(float)local_a8) {
      iVar3 = 1;
      iVar7 = 0;
      fVar5 = 0.0;
      do {
        local_9c.position.m_data[0] = 0.0;
        local_a0 = fVar5;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_9c);
        }
        else {
          *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar4 = 0;
        do {
          local_9c.position.m_data[0] = (float)((iVar7 + iVar4) / 2) * local_cc + -0.8;
          local_9c.position.m_data[1] = (float)iVar4 * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = (float)(iVar3 + iVar4);
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_d4;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 == 1);
        local_9c.position.m_data[0] = 0.0;
        if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_9c);
        }
        else {
          *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0;
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        fVar5 = (float)((int)local_a0 + 1);
        iVar3 = iVar3 + 2;
        iVar7 = iVar7 + 2;
      } while (fVar5 != (float)local_a8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_78,&local_50);
    local_9c.position.m_data[0] = 0.0;
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_9c);
    }
    else {
      *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    if (0 < (int)(float)local_a8) {
      local_a0 = local_d0 + -0.8;
      local_a8 = (ulong)(uint)-(int)(float)local_a8;
      uVar2 = 1;
      do {
        if (uVar2 == 1) {
          local_9c.position.m_data[0] = -0.8;
          local_9c.position.m_data[1] = -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 1.4013e-45;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 1;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_9c.position.m_data[0] = -0.8;
          local_9c.position.m_data[1] = local_a0;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = 2.8026e-45;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 2;
LAB_004ffa15:
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_9c.position.m_data[0] = (float)(uVar2 >> 1) * local_cc + -0.8;
          local_9c.position.m_data[1] = (float)(uVar2 & 1) * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = (float)(uVar2 + 1);
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_d4;
            goto LAB_004ffa15;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
        }
        iVar3 = (int)local_a8 + uVar2;
        uVar2 = uVar2 + 1;
      } while (iVar3 != 0);
    }
    local_9c.position.m_data[0] = 0.0;
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_9c);
    }
    else {
      *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_78,&local_50);
    if (0 < (int)(float)local_a8) {
      fVar1 = 0.0;
      fVar5 = 1.4013e-45;
      do {
        iVar3 = 3;
        local_a0 = fVar1;
        local_7c = fVar5;
        do {
          uVar2 = ((int)fVar5 - ((int)((int)fVar5 - 1U) >> 0x1f)) - 1;
          local_9c.position.m_data[0] = (float)((int)uVar2 >> 1) * local_cc + -0.8;
          local_9c.position.m_data[1] =
               (float)(int)(((int)fVar5 - 1U) - (uVar2 & 0xfffffffe)) * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_d4 = fVar5;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar5;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_d4 = 0.0;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          fVar5 = (float)((int)fVar5 + 1);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        fVar1 = (float)((int)local_a0 + 1);
        fVar5 = (float)((int)local_7c + 3);
      } while (fVar1 != (float)local_a8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_78,&local_50);
    if (0 < (int)(float)local_a8) {
      iVar3 = 0;
      do {
        if (iVar3 == 0) {
          fVar5 = 1.4013e-45;
          do {
            local_9c.position.m_data[0] = (float)((int)fVar5 - 1U >> 1) * local_cc + -0.8;
            local_9c.position.m_data[1] = (float)((int)fVar5 - 1U & 1) * local_d0 + -0.8;
            local_9c.position.m_data[2] = 0.0;
            local_9c.position.m_data[3] = 1.0;
            local_9c.color.m_data[0] = 1.0;
            local_9c.color.m_data[1] = 0.0;
            local_9c.color.m_data[2] = 0.0;
            local_9c.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_78,&local_9c);
            if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_d4 = fVar5;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
            }
            else {
              *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = (uint)fVar5;
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_d4 = 0.0;
            if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
            }
            else {
              *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            fVar5 = (float)((int)fVar5 + 1);
          } while (fVar5 != 5.60519e-45);
        }
        else {
          uVar2 = (iVar3 - (iVar3 + 2 >> 0x1f)) + 2;
          local_9c.position.m_data[0] = (float)((int)uVar2 >> 1) * local_cc + -0.8;
          local_9c.position.m_data[1] =
               (float)(int)((iVar3 + 2) - (uVar2 & 0xfffffffe)) * local_d0 + -0.8;
          local_9c.position.m_data[2] = 0.0;
          local_9c.position.m_data[3] = 1.0;
          local_9c.color.m_data[0] = 1.0;
          local_9c.color.m_data[1] = 0.0;
          local_9c.color.m_data[2] = 0.0;
          local_9c.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_78,&local_9c);
          local_d4 = (float)(iVar3 + 3);
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_d4;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_d4 = 0.0;
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d4);
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        iVar3 = iVar3 + 1;
      } while ((float)iVar3 != (float)local_a8);
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (local_58,&local_78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_60,&local_c8);
  if (local_78.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrimitiveTopologyTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount + primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				const Vertex4RGBA vertex =
				{
					tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
					red
				};

				vertices.push_back(vertex);
				indices.push_back(primitiveNdx);
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((primitiveNdx * 2 + vertexNdx));
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(primitiveSizeX, 0.0f, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle), primitiveSizeY * deFloatSin(stepAngle), 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				indices.push_back(0);

				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 2 + vertexNdx + 1);
				}

				indices.push_back(0);
			}
			break;


		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);
			indices.push_back(0);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx + 1);
					indices.push_back(0);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx + 1);
						indices.push_back(0);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2 + 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}